

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.c
# Opt level: O0

int runner(TestReporter *reporter,char *test_library_name,char *suite_name,char *test_name,
          _Bool verbose,_Bool dont_run)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  CgreenVector *pCVar4;
  CgreenVector *tests_00;
  char *symbolic_name;
  undefined8 uVar5;
  byte bVar6;
  TestReporter *in_RCX;
  undefined8 in_RSI;
  byte in_R8B;
  byte in_R9B;
  char *absolute_library_name;
  CgreenVector *tests;
  void *test_library_handle;
  int status;
  _Bool in_stack_00000387;
  char *in_stack_00000388;
  char *in_stack_ffffffffffffff88;
  undefined1 verbose_00;
  undefined2 in_stack_ffffffffffffffd4;
  int local_4;
  
  bVar6 = in_R8B & 1;
  bVar1 = in_R9B & 1;
  local_4 = 0;
  uVar5 = in_RSI;
  pCVar4 = discover_tests_in(in_stack_00000388,in_stack_00000387);
  verbose_00 = (undefined1)((ulong)uVar5 >> 0x38);
  iVar2 = count((CgreenVector *)0x10399e);
  if (iVar2 == 0) {
    printf("No tests found in \'%s\'.\n",in_RSI);
    local_4 = 1;
  }
  else {
    if ((bVar6 & 1) != 0) {
      uVar3 = count((CgreenVector *)0x1039d4);
      printf("Discovered %d test(s)\n",(ulong)uVar3);
    }
    tests_00 = (CgreenVector *)absolute(in_stack_ffffffffffffff88);
    pCVar4 = sorted_test_items_from(pCVar4);
    if ((bVar6 & 1) != 0) {
      printf("Opening [%s]",in_RSI);
    }
    symbolic_name = (char *)dlopen(tests_00,2);
    if (symbolic_name == (char *)0x0) {
      uVar5 = dlerror();
      panic("tools/runner.c",0x12e,"dlopen failure when trying to run \'%s\' (error: %s)\n",tests_00
            ,uVar5);
    }
    if ((bVar1 & 1) == 0) {
      local_4 = run_tests(in_RCX,(char *)CONCAT17(bVar6,CONCAT16(bVar1,CONCAT24(
                                                  in_stack_ffffffffffffffd4,local_4))),symbolic_name
                          ,pCVar4,tests_00,(_Bool)verbose_00);
    }
    dlclose(symbolic_name);
    free(tests_00);
    destroy_cgreen_vector(pCVar4);
  }
  return local_4;
}

Assistant:

int runner(TestReporter *reporter, const char *test_library_name,
           const char *suite_name, const char *test_name,
           bool verbose, bool dont_run) {
    int status = 0;
    void *test_library_handle = NULL;

    CgreenVector *tests = discover_tests_in(test_library_name, verbose);

    if (count(tests) == 0) {
        printf("No tests found in '%s'.\n", test_library_name);
        return 1;
    }

    if (verbose)
        printf("Discovered %d test(s)\n", count(tests));

    char *absolute_library_name = absolute(test_library_name);
    tests = sorted_test_items_from(tests);
    if (verbose)
        printf("Opening [%s]", test_library_name);
    test_library_handle = dlopen(absolute_library_name, RTLD_NOW);
    if (test_library_handle == NULL) {
        PANIC("dlopen failure when trying to run '%s' (error: %s)\n",
              absolute_library_name, dlerror());
        status = 2;
    } else {
        if (!dont_run) {
            status = run_tests(reporter, suite_name, test_name, test_library_handle,
                               tests, verbose);
        }
        dlclose(test_library_handle);
    }
    free(absolute_library_name);

    destroy_cgreen_vector(tests);

    return status;
}